

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void writesection(Section *sect,FILE *f)

{
  bool bVar1;
  uint32_t i;
  Patch *local_28;
  Patch *patch;
  bool isFragment;
  bool isUnion;
  FILE *f_local;
  Section *sect_local;
  
  putstring(sect->name,f);
  putlong(sect->size,f);
  putc(sect->type | (uint)(sect->modifier == SECTION_UNION) << 7 |
       (uint)(sect->modifier == SECTION_FRAGMENT) << 6,(FILE *)f);
  putlong(sect->org,f);
  putlong(sect->bank,f);
  putc((uint)sect->align,(FILE *)f);
  putlong((uint)sect->alignOfs,f);
  bVar1 = sect_HasData(sect->type);
  if (bVar1) {
    fwrite(sect->data,1,(ulong)sect->size,(FILE *)f);
    i = countPatches(sect);
    putlong(i,f);
    for (local_28 = sect->patches; local_28 != (Patch *)0x0; local_28 = local_28->next) {
      writepatch(local_28,f);
    }
  }
  return;
}

Assistant:

static void writesection(struct Section const *sect, FILE *f)
{
	putstring(sect->name, f);

	putlong(sect->size, f);

	bool isUnion = sect->modifier == SECTION_UNION;
	bool isFragment = sect->modifier == SECTION_FRAGMENT;

	putc(sect->type | isUnion << 7 | isFragment << 6, f);

	putlong(sect->org, f);
	putlong(sect->bank, f);
	putc(sect->align, f);
	putlong(sect->alignOfs, f);

	if (sect_HasData(sect->type)) {
		fwrite(sect->data, 1, sect->size, f);
		putlong(countPatches(sect), f);

		for (struct Patch const *patch = sect->patches; patch != NULL;
		     patch = patch->next)
			writepatch(patch, f);
	}
}